

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O2

bool __thiscall DOMTest::testLSExceptions(DOMTest *this)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  undefined8 uVar7;
  XMLCh *pXVar8;
  ParserAborter aborter;
  
  plVar2 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(L"LS");
  plVar3 = (long *)(**(code **)(*plVar2 + 0x10))
                             (plVar2,1,0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,0);
  plVar2 = (long *)(**(code **)(*plVar2 + 0x20))
                             (plVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("<?xml version=\'1.0\'?><!DOCTYPE root[<!ENTITY ent1 \'Dallas. &ent3; #5668\'><!ENTITY ent2 \'1900 Dallas Road<![CDATA[ (East) ]]>\'><!ENTITY ent3 \'California. &ent4; PO\'>  <!ENTITY ent4 \'USA \'><!ENTITY ent5 \'The Content &ent6; never reached\'><!ENTITY ent6 \'ends here. <foo/>\'>]><root>&ent1; &ent2;<elem>Home </elem><elem>Test: &ent5;</elem></root>"
             ,tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar2 + 0x40))(plVar2,tempStr);
  (**(code **)(*plVar3 + 0x30))(plVar3);
  (**(code **)(*plVar3 + 0x38))(plVar3,plVar2);
  fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x138a);
  (**(code **)(*plVar3 + 0x30))(plVar3);
  (**(code **)(*plVar3 + 0x38))(plVar3,plVar2);
  fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x139c);
  (**(code **)(*plVar3 + 0x30))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x10))(plVar3);
  (**(code **)(*plVar4 + 8))(plVar4,&xercesc_4_0::XMLUni::fgDOMEntities,0);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3,plVar2);
  if ((plVar4 != (long *)0x0) && (lVar5 = (**(code **)(*plVar4 + 0x68))(plVar4), lVar5 != 0)) {
    plVar4 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
    (**(code **)(*plVar4 + 0x200))(plVar4);
  }
  fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13b2);
  xercesc_4_0::XMLString::transcode
            ("<?xml version=\'1.0\'?><root xmlns:x=\'urn:yyy\'><elem xmlns:x=\'urn:xxx\'>Home</elem><elem2>Test</elem2><elem>Home</elem><elem2>Test</elem2></root>"
             ,tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar2 + 0x40))(plVar2,tempStr);
  (**(code **)(*plVar3 + 0x30))(plVar3);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3,plVar2);
  if ((plVar4 != (long *)0x0) && (lVar5 = (**(code **)(*plVar4 + 0x68))(plVar4), lVar5 != 0)) {
    plVar4 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
    (**(code **)(*plVar4 + 0x200))(plVar4);
  }
  fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13cf);
  xercesc_4_0::XMLString::transcode
            ("root",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar3 + 0x30))(plVar3,0);
  plVar4 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3,plVar2);
  plVar6 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  uVar7 = (**(code **)(*plVar6 + 0x1e0))(plVar6);
  (**(code **)(*plVar3 + 0x50))(plVar3,plVar2,uVar7,1);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
  pXVar8 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar8,tempStr2);
  if (!bVar1) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13e3);
  }
  plVar4 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3,plVar2);
  plVar6 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  uVar7 = (**(code **)(*plVar6 + 0x1e0))(plVar6);
  (**(code **)(*plVar3 + 0x50))(plVar3,plVar2,uVar7,2);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
  pXVar8 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar8,tempStr2);
  if (!bVar1) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13ec);
  }
  plVar4 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3,plVar2);
  plVar6 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  uVar7 = (**(code **)(*plVar6 + 0x1e0))(plVar6);
  (**(code **)(*plVar3 + 0x50))(plVar3,plVar2,uVar7,3);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
  pXVar8 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar8,tempStr2);
  if (!bVar1) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13f5);
  }
  plVar4 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3,plVar2);
  plVar6 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  uVar7 = (**(code **)(*plVar6 + 0x1e0))(plVar6);
  (**(code **)(*plVar3 + 0x50))(plVar3,plVar2,uVar7,4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x1f8))(plVar4);
  pXVar8 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar8,tempStr2);
  if (!bVar1) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x13fe);
  }
  plVar4 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3,plVar2);
  plVar6 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  uVar7 = (**(code **)(*plVar6 + 0x1e0))(plVar6);
  (**(code **)(*plVar3 + 0x50))(plVar3,plVar2,uVar7,5);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
  pXVar8 = (XMLCh *)(**(code **)(*plVar4 + 0x10))(plVar4);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar8,tempStr2);
  if (!bVar1) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x1407);
  }
  plVar4 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3,plVar2);
  xercesc_4_0::XMLString::transcode
            ("<x:root/>",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar2 + 0x40))(plVar2,tempStr2);
  plVar6 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  uVar7 = (**(code **)(*plVar6 + 0x1e0))(plVar6);
  (**(code **)(*plVar3 + 0x50))(plVar3,plVar2,uVar7,1);
  xercesc_4_0::XMLString::transcode
            ("urn:xxx",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x68))(plVar4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
  plVar4 = (long *)(**(code **)(*plVar4 + 0x1e0))(plVar4);
  pXVar8 = (XMLCh *)(**(code **)(*plVar4 + 0xb0))(plVar4);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar8,tempStr2);
  if (!bVar1) {
    fprintf(_stderr,"checking testLSExceptions failed at line %i\n",0x1415);
  }
  (**(code **)(*plVar2 + 0x80))(plVar2);
  (**(code **)(*plVar3 + 0x60))(plVar3);
  return false;
}

Assistant:

bool DOMTest::testLSExceptions() {
    bool OK = true;

	const char* sXml="<?xml version='1.0'?>"
				"<!DOCTYPE root["
                "<!ENTITY ent1 'Dallas. &ent3; #5668'>"
                "<!ENTITY ent2 '1900 Dallas Road<![CDATA[ (East) ]]>'>"
                "<!ENTITY ent3 'California. &ent4; PO'>  "
                "<!ENTITY ent4 'USA '>"
                "<!ENTITY ent5 'The Content &ent6; never reached'>"
                "<!ENTITY ent6 'ends here. <foo/>'>"
                "]>"
                "<root>&ent1; &ent2;"
                  "<elem>Home </elem>"
                  "<elem>Test: &ent5;</elem>"
                "</root>";

    static const XMLCh gLS[] = { chLatin_L, chLatin_S, chNull };
    DOMImplementationLS *impl = (DOMImplementationLS*)DOMImplementationRegistry::getDOMImplementation(gLS);
    DOMLSParser       *domBuilder = impl->createLSParser(DOMImplementationLS::MODE_SYNCHRONOUS, 0);
    DOMLSInput        *input = impl->createLSInput();
    XMLString::transcode(sXml, tempStr, 3999);
    input->setStringData(tempStr);
    try
    {
        ParserAborter aborter;
        domBuilder->setFilter(&aborter);
        domBuilder->parse(input);

        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }
    catch(DOMLSException& e)
    {
        if(e.code!=DOMLSException::PARSE_ERR)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }

    try
    {
        ParserNester nester(domBuilder, input);
        domBuilder->setFilter(&nester);
        domBuilder->parse(input);

        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }
    catch(DOMException& e)
    {
        if(e.code!=DOMException::INVALID_STATE_ERR)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }

    try
    {
        ParserSkipper skipper;
        domBuilder->setFilter(&skipper);
        domBuilder->getDomConfig()->setParameter(XMLUni::fgDOMEntities, false);
        DOMDocument* doc=domBuilder->parse(input);

        // verify that we get only 3 calls: for the text node, the CDATA section and the root element
        if(doc==NULL || doc->getDocumentElement()==NULL || doc->getDocumentElement()->getChildElementCount()!=0 || skipper.fCallbackCalls!=3)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }
    catch(DOMException&)
    {
        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }

    // this XML should trigger reuse of DOMElement
	const char* sXml2="<?xml version='1.0'?>"
                "<root xmlns:x='urn:yyy'>"
                  "<elem xmlns:x='urn:xxx'>Home</elem>"
                  "<elem2>Test</elem2>"
                  "<elem>Home</elem>"
                  "<elem2>Test</elem2>"
                "</root>";
    XMLString::transcode(sXml2, tempStr, 3999);
    input->setStringData(tempStr);
    try
    {
        ParserSkipper skipper;
        domBuilder->setFilter(&skipper);
        DOMDocument* doc=domBuilder->parse(input);

        // verify that we get only 5 calls: for the root element, the two elem2 and the two text nodes under them
        if(doc==NULL || doc->getDocumentElement()==NULL || doc->getDocumentElement()->getChildElementCount()!=2 || skipper.fCallbackCalls!=5)
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }
    catch(DOMException&)
    {
        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }

    // test for parseWithContext
    try
    {
        XMLString::transcode("root", tempStr2, 3999);
        domBuilder->setFilter(NULL);
        DOMDocument* doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_APPEND_AS_CHILDREN);
        // the first 'elem' child of 'root' must have a 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_REPLACE_CHILDREN);
        // the first 'elem' child of 'root' must have a 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_INSERT_BEFORE);
        // the first child of 'root' must be another 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_INSERT_AFTER);
        // the node after the first child of 'root' must be another 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getNextElementSibling()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        doc=domBuilder->parse(input);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_REPLACE);
        // the first child of 'root' must be another 'root' child
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getNodeName(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }

        // verify that namespaces are in scope
        doc=domBuilder->parse(input);
	    const char* sXml3="<x:root/>";
        XMLString::transcode(sXml3, tempStr2, 3999);
        input->setStringData(tempStr2);
        domBuilder->parseWithContext(input, doc->getDocumentElement()->getFirstElementChild(), DOMLSParser::ACTION_APPEND_AS_CHILDREN);
        // the first 'elem' child of 'root' must have a 'x:root' child
        XMLString::transcode("urn:xxx", tempStr2, 3999);
        if(!XMLString::equals(doc->getDocumentElement()->getFirstElementChild()->getFirstElementChild()->getNamespaceURI(), tempStr2))
        {
            fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
            OK=false;
        }
    }
    catch(DOMException&)
    {
        fprintf(stderr, "checking testLSExceptions failed at line %i\n",  __LINE__);
        OK=false;
    }

    input->release();
    domBuilder->release();

    return OK;
}